

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heartbleed.c
# Opt level: O0

void test_openssl_1_0_1f(uchar *test_case,int len)

{
  undefined1 local_40 [8];
  SSL s;
  int len_local;
  uchar *test_case_local;
  
  s._36_4_ = len;
  printf("\nTEST : %s\n","void test_openssl_1_0_1f(unsigned char *, int)");
  local_40 = (undefined1  [8])malloc(0x10);
  (((S3 *)local_40)->rrec).data = test_case;
  (((S3 *)local_40)->rrec).length = s._36_4_;
  s.s3 = (S3 *)0x0;
  dtls1_process_heartbeat((SSL *)local_40);
  return;
}

Assistant:

void test_openssl_1_0_1f(unsigned char *test_case, int len) {
  printf("\nTEST : %s\n", __PRETTY_FUNCTION__);
  SSL s;
  s.s3 = malloc(sizeof(S3));
  s.s3->rrec.data = test_case;
  s.s3->rrec.length = len;
  s.msg_callback = NULL;
  dtls1_process_heartbeat(&s);
}